

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<DomInclude_*>::~QList(QList<DomInclude_*> *this)

{
  QArrayDataPointer<DomInclude_*>::~QArrayDataPointer(&this->d);
  return;
}

Assistant:

class QList
#ifndef Q_QDOC
    : public QListSpecialMethods<T>
#endif
{
    using Data = QTypedArrayData<T>;
    using DataOps = QArrayDataOps<T>;
    using DataPointer = QArrayDataPointer<T>;
    class DisableRValueRefs {};

    friend class ::tst_QList;

    DataPointer d;

    template <typename V, typename U> friend qsizetype QtPrivate::indexOf(const QList<V> &list, const U &u, qsizetype from) noexcept;
    template <typename V, typename U> friend qsizetype QtPrivate::lastIndexOf(const QList<V> &list, const U &u, qsizetype from) noexcept;
    // This alias prevents the QtPrivate namespace from being exposed into the docs.
    template <typename InputIterator>
    using if_input_iterator = QtPrivate::IfIsInputIterator<InputIterator>;

public:
    using Type = T;
    using value_type = T;
    using pointer = T *;
    using const_pointer = const T *;
    using reference = T &;
    using const_reference = const T &;
    using size_type = qsizetype;
    using difference_type = qptrdiff;
#ifndef Q_QDOC
    using parameter_type = typename DataPointer::parameter_type;
    using rvalue_ref = typename std::conditional<DataPointer::pass_parameter_by_value, DisableRValueRefs, T &&>::type;
#else  // simplified aliases for QDoc
    using parameter_type = const T &;
    using rvalue_ref = T &&;
#endif

    DataPointer &data_ptr() &             { return d; }
    const DataPointer &data_ptr() const & { return d; }
    DataPointer &&data_ptr() &&           { return std::move(d); }
    // No current use-case for a `const &&` overload

    class const_iterator;
    class iterator {
        friend class QList<T>;
        friend class const_iterator;
        T *i = nullptr;
#ifdef QT_STRICT_QLIST_ITERATORS
        inline constexpr explicit iterator(T *n) : i(n) {}
#endif

    public:
        using difference_type = qsizetype;
        using value_type = T;
#ifdef QT_COMPILER_HAS_LWG3346
        using iterator_concept = std::contiguous_iterator_tag;
#endif
        using element_type = value_type;
        using iterator_category = std::random_access_iterator_tag;
        using pointer = T *;
        using reference = T &;

        inline constexpr iterator() = default;
#ifndef QT_STRICT_QLIST_ITERATORS
        inline constexpr explicit iterator(T *n) : i(n) {}
#endif
        inline T &operator*() const { return *i; }
        inline T *operator->() const { return i; }
        inline T &operator[](qsizetype j) const { return *(i + j); }
#ifdef __cpp_lib_three_way_comparison
        friend constexpr auto operator<=>(iterator, iterator) noexcept = default;
        friend constexpr bool operator==(iterator, iterator) noexcept = default;
#else
        inline constexpr bool operator==(iterator o) const { return i == o.i; }
        inline constexpr bool operator!=(iterator o) const { return i != o.i; }
        inline constexpr bool operator<(iterator other) const { return i < other.i; }
        inline constexpr bool operator<=(iterator other) const { return i <= other.i; }
        inline constexpr bool operator>(iterator other) const { return i > other.i; }
        inline constexpr bool operator>=(iterator other) const { return i >= other.i; }
        inline constexpr bool operator==(const_iterator o) const { return i == o.i; }
        inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }
        inline constexpr bool operator<(const_iterator other) const { return i < other.i; }
        inline constexpr bool operator<=(const_iterator other) const { return i <= other.i; }
        inline constexpr bool operator>(const_iterator other) const { return i > other.i; }
        inline constexpr bool operator>=(const_iterator other) const { return i >= other.i; }
#endif // __cpp_lib_three_way_comparison
        inline constexpr bool operator==(pointer p) const { return i == p; }
        inline constexpr bool operator!=(pointer p) const { return i != p; }
        inline iterator &operator++() { ++i; return *this; }
        inline iterator operator++(int) { auto copy = *this; ++*this; return copy; }
        inline iterator &operator--() { --i; return *this; }
        inline iterator operator--(int) { auto copy = *this; --*this; return copy; }
        inline qsizetype operator-(iterator j) const { return i - j.i; }
#if QT_DEPRECATED_SINCE(6, 3) && !defined(QT_STRICT_QLIST_ITERATORS)
        QT_DEPRECATED_VERSION_X_6_3("Use operator* or operator-> rather than relying on "
                                    "the implicit conversion between a QList/QVector::iterator "
                                    "and a raw pointer")
        inline operator T*() const { return i; }

        template <typename Int> std::enable_if_t<std::is_integral_v<Int>, iterator>
        &operator+=(Int j) { i+=j; return *this; }
        template <typename Int> std::enable_if_t<std::is_integral_v<Int>, iterator>
        &operator-=(Int j) { i-=j; return *this; }
        template <typename Int> std::enable_if_t<std::is_integral_v<Int>, iterator>
        operator+(Int j) const { return iterator(i+j); }
        template <typename Int> std::enable_if_t<std::is_integral_v<Int>, iterator>
        operator-(Int j) const { return iterator(i-j); }
        template <typename Int> friend std::enable_if_t<std::is_integral_v<Int>, iterator>
        operator+(Int j, iterator k) { return k + j; }
#else
        inline iterator &operator+=(qsizetype j) { i += j; return *this; }
        inline iterator &operator-=(qsizetype j) { i -= j; return *this; }
        inline iterator operator+(qsizetype j) const { return iterator(i + j); }
        inline iterator operator-(qsizetype j) const { return iterator(i - j); }
        friend inline iterator operator+(qsizetype j, iterator k) { return k + j; }
#endif
    }